

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t32.inc.c
# Opt level: O0

void disas_t32_extract_ldst_rr(DisasContext_conflict1 *ctx,arg_ldst_rr *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t insn_local;
  arg_ldst_rr *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,0xc,4);
  a->rt = uVar1;
  uVar1 = extract32(insn,4,2);
  a->shimm = uVar1;
  uVar1 = extract32(insn,0,4);
  a->rm = uVar1;
  a->p = 1;
  a->w = 0;
  a->u = 1;
  a->shtype = 0;
  return;
}

Assistant:

static void disas_t32_extract_ldst_rr(DisasContext *ctx, arg_ldst_rr *a, uint32_t insn)
{
    a->rn = extract32(insn, 16, 4);
    a->rt = extract32(insn, 12, 4);
    a->shimm = extract32(insn, 4, 2);
    a->rm = extract32(insn, 0, 4);
    a->p = 1;
    a->w = 0;
    a->u = 1;
    a->shtype = 0;
}